

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O0

bool __thiscall
Js::ProbeContainer::DispatchExceptionBreakpoint
          (ProbeContainer *this,InterpreterHaltState *pHaltState)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  Var pvVar5;
  anon_class_24_3_1fffcdf5 local_60;
  anon_class_32_4_fcddd404 local_48;
  int local_28;
  bool local_21;
  int currentOffset;
  bool fSuccess;
  InterpreterHaltState *pHaltState_local;
  ProbeContainer *this_local;
  
  _currentOffset = pHaltState;
  pHaltState_local = (InterpreterHaltState *)this;
  Output::Trace(DebuggerPhase,
                L"ProbeContainer::DispatchExceptionBreakpoint: start: this=%p, pHaltState=%p\n",this
                ,pHaltState);
  local_21 = false;
  if (this->haltCallbackProbe != (HaltCallback *)0x0) {
    uVar3 = (*this->haltCallbackProbe->_vptr_HaltCallback[3])();
    if ((uVar3 & 1) == 0) {
      bVar2 = DebugManager::IsAtDispatchHalt(this->debugManager);
      if (!bVar2) {
        if (_currentOffset->stopType != STOP_EXCEPTIONTHROW) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                      ,0x191,"(pHaltState->stopType == STOP_EXCEPTIONTHROW)",
                                      "pHaltState->stopType == STOP_EXCEPTIONTHROW");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        pvVar5 = JavascriptExceptionObject::GetThrownObject
                           (_currentOffset->exceptionObject,(ScriptContext *)0x0);
        this->jsExceptionObject = pvVar5;
        local_28 = -1;
        local_48.pHaltState = (InterpreterHaltState **)&currentOffset;
        local_48.currentOffset = &local_28;
        local_48.fSuccess = &local_21;
        local_60.pHaltState = (InterpreterHaltState **)&currentOffset;
        local_60.currentOffset = &local_28;
        local_60.this = this;
        local_48.this = this;
        TryFinally<Js::ProbeContainer::DispatchExceptionBreakpoint(Js::InterpreterHaltState*)::__0,Js::ProbeContainer::DispatchExceptionBreakpoint(Js::InterpreterHaltState*)::__1>
                  (&local_48,&local_60);
        Output::Trace(DebuggerPhase,
                      L"ProbeContainer::DispatchExceptionBreakpoint: end: pHaltState=%p, fSuccess=%d\n"
                      ,_currentOffset,(ulong)(local_21 & 1));
        goto LAB_00c8a9f6;
      }
    }
  }
  Output::Trace(DebuggerPhase,
                L"ProbeContainer::DispatchExceptionBreakpoint: not in break mode: pHaltState=%p\n",
                _currentOffset);
LAB_00c8a9f6:
  this_local._7_1_ = (bool)(local_21 & 1);
  return this_local._7_1_;
}

Assistant:

bool ProbeContainer::DispatchExceptionBreakpoint(InterpreterHaltState* pHaltState)
    {
        OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchExceptionBreakpoint: start: this=%p, pHaltState=%p\n"), this, pHaltState);
        bool fSuccess = false;
        if (!haltCallbackProbe || haltCallbackProbe->IsInClosedState() || debugManager->IsAtDispatchHalt())
        {
            OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchExceptionBreakpoint: not in break mode: pHaltState=%p\n"), pHaltState);
            // Will not be able to handle multiple break-hits.
            return fSuccess;
        }

        Assert(pHaltState->stopType == STOP_EXCEPTIONTHROW);

        jsExceptionObject = pHaltState->exceptionObject->GetThrownObject(nullptr);

        // Will store current offset of the bytecode block.
        int currentOffset = -1;

        TryFinally([&]()
        {
            InitializeLocation(pHaltState, false);
            OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchExceptionBreakpoint: initialized location: pHaltState=%p, IsInterpreterFrame=%d\n"),
                pHaltState, pHaltState->IsValid(), pHaltState->topFrame && pHaltState->topFrame->IsInterpreterFrame());

            // The ByteCodeReader should be available at this point, but because of possibility of garbled frame, we shouldn't hit AV
            if (pHaltState->IsValid() && pHaltState->GetFunction()->GetScriptContext()->IsScriptContextInDebugMode())
            {
#if DBG
                pHaltState->GetFunction()->MustBeInDebugMode();
#endif

                // For interpreter frames, change the current location pointer of bytecode block, as it might be pointing to the next statement on the body.
                // In order to generated proper binding of break on exception to the statement, the bytecode offset needed to be on the same span
                // of the statement.
                // For native frames the offset is always current.
                // Move back a single byte to ensure that it falls under on the same statement.
                if (pHaltState->topFrame->IsInterpreterFrame())
                {
                    currentOffset = pHaltState->GetCurrentOffset();
                    Assert(currentOffset > 0);
                    pHaltState->SetCurrentOffset(currentOffset - 1);
                }

                // an inline breakpoint is being dispatched deactivate other stopping controllers
                debugManager->stepController.Deactivate(pHaltState);
                debugManager->asyncBreakController.Deactivate();

                pHaltState->GetFunction()->CheckAndRegisterFuncToDiag(pScriptContext);

                ScriptContext *pTopFuncContext = pHaltState->GetFunction()->GetScriptContext();

                // If the top function's context is different from the current context, that means current frame is not alive anymore and breaking here cannot not happen.
                // So in that case we will consider the top function's context and break on that context.
                if (pTopFuncContext != pScriptContext)
                {
                    OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchExceptionBreakpoint: top function's context is different from the current context: pHaltState=%p, haltCallbackProbe=%p\n"),
                        pHaltState, pTopFuncContext->GetDebugContext()->GetProbeContainer()->haltCallbackProbe);
                    if (pTopFuncContext->GetDebugContext()->GetProbeContainer()->haltCallbackProbe)
                    {
                        pTopFuncContext->GetDebugContext()->GetProbeContainer()->haltCallbackProbe->DispatchHalt(pHaltState);
                        fSuccess = true;
                    }
                }
                else
                {
                    haltCallbackProbe->DispatchHalt(pHaltState);
                    fSuccess = true;
                }
            }
        },
        [&](bool)
        {
            // If the next statement has changed, we need to log that to exception object so that it will not try to advance to next statement again.
            pHaltState->exceptionObject->SetIgnoreAdvanceToNextStatement(IsNextStatementChanged);

            // Restore the current offset;
            if (currentOffset != -1 && pHaltState->topFrame->IsInterpreterFrame())
            {
                pHaltState->SetCurrentOffset(currentOffset);
            }

            DestroyLocation();
        });

        OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchExceptionBreakpoint: end: pHaltState=%p, fSuccess=%d\n"), pHaltState, fSuccess);
        return fSuccess;
    }